

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::_constructor(CmdLine *this)

{
  void *pvVar1;
  Visitor *v_00;
  CmdLine *this_00;
  long *in_RDI;
  SwitchArg *ignore;
  SwitchArg *vers;
  SwitchArg *help;
  Visitor *v;
  Arg *in_stack_fffffffffffffdf8;
  Arg *ptr;
  CmdLine *in_stack_fffffffffffffe00;
  CmdLineInterface *in_stack_fffffffffffffe08;
  HelpVisitor *in_stack_fffffffffffffe10;
  undefined1 default_val;
  string *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  allocator<char> *in_stack_fffffffffffffe30;
  allocator<char> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  undefined1 local_189 [33];
  string local_168 [32];
  string local_148 [32];
  CmdLine *local_128;
  undefined1 local_11a;
  undefined1 local_119 [40];
  undefined1 local_f1 [40];
  undefined1 local_c9 [33];
  string *local_a8;
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98 [39];
  undefined1 local_71 [40];
  allocator<char> local_49;
  string local_48 [32];
  void *local_28;
  allocator<char> *local_10;
  
  pvVar1 = operator_new(8);
  StdOutput::StdOutput((StdOutput *)in_stack_fffffffffffffe00);
  in_RDI[0x1a] = (long)pvVar1;
  Arg::setDelimiter('\0');
  if ((*(byte *)((long)in_RDI + 0xda) & 1) != 0) {
    pvVar1 = operator_new(0x18);
    HelpVisitor::HelpVisitor
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (CmdLineOutput **)in_stack_fffffffffffffe00);
    local_10 = (allocator<char> *)pvVar1;
    pvVar1 = operator_new(0xa8);
    local_9a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30
              );
    in_stack_fffffffffffffe40 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30
              );
    in_stack_fffffffffffffe38 = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30
              );
    SwitchArg::SwitchArg
              ((SwitchArg *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
               SUB81((ulong)in_stack_fffffffffffffe10 >> 0x38,0),
               (Visitor *)in_stack_fffffffffffffe08);
    local_9a = 0;
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    std::__cxx11::string::~string((string *)(local_71 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_71);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
    local_28 = pvVar1;
    (**(code **)(*in_RDI + 0x18))(in_RDI,pvVar1);
    deleteOnExit(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    deleteOnExit(in_stack_fffffffffffffe00,(Visitor *)in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffe30 = (allocator<char> *)operator_new(0x18);
    VersionVisitor::VersionVisitor
              ((VersionVisitor *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (CmdLineOutput **)in_stack_fffffffffffffe00);
    local_10 = in_stack_fffffffffffffe30;
    in_stack_fffffffffffffe20 = (string *)operator_new(0xa8);
    local_11a = 1;
    in_stack_fffffffffffffe28 = (string *)local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30
              );
    in_stack_fffffffffffffe18 = (string *)local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30
              );
    in_stack_fffffffffffffe10 = (HelpVisitor *)local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30
              );
    SwitchArg::SwitchArg
              ((SwitchArg *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
               SUB81((ulong)in_stack_fffffffffffffe10 >> 0x38,0),
               (Visitor *)in_stack_fffffffffffffe08);
    local_11a = 0;
    std::__cxx11::string::~string((string *)(local_119 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_119);
    std::__cxx11::string::~string((string *)(local_f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_f1);
    std::__cxx11::string::~string((string *)(local_c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c9);
    local_a8 = in_stack_fffffffffffffe20;
    (**(code **)(*in_RDI + 0x18))(in_RDI,in_stack_fffffffffffffe20);
    deleteOnExit(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    deleteOnExit(in_stack_fffffffffffffe00,(Visitor *)in_stack_fffffffffffffdf8);
  }
  default_val = (undefined1)((ulong)in_stack_fffffffffffffe10 >> 0x38);
  v_00 = (Visitor *)operator_new(8);
  IgnoreRestVisitor::IgnoreRestVisitor((IgnoreRestVisitor *)in_stack_fffffffffffffe00);
  local_10 = (allocator<char> *)v_00;
  this_00 = (CmdLine *)operator_new(0xa8);
  Arg::flagStartString_abi_cxx11_();
  Arg::ignoreNameString_abi_cxx11_();
  ptr = (Arg *)local_189;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  SwitchArg::SwitchArg
            ((SwitchArg *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(bool)default_val,v_00);
  std::__cxx11::string::~string((string *)(local_189 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_189);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_148);
  local_128 = this_00;
  (**(code **)(*in_RDI + 0x18))(in_RDI,this_00);
  deleteOnExit(this_00,ptr);
  deleteOnExit(this_00,(Visitor *)ptr);
  return;
}

Assistant:

inline void CmdLine::_constructor()
{
	_output = new StdOutput;

	Arg::setDelimiter( _delimiter );

	Visitor* v;

	if ( _helpAndVersion )
	{
		v = new HelpVisitor( this, &_output );
		SwitchArg* help = new SwitchArg("h","help",
		                      "Displays usage information and exits.",
		                      false, v);
		add( help );
		deleteOnExit(help);
		deleteOnExit(v);

		v = new VersionVisitor( this, &_output );
		SwitchArg* vers = new SwitchArg("","version",
		                      "Displays version information and exits.",
		                      false, v);
		add( vers );
		deleteOnExit(vers);
		deleteOnExit(v);
	}

	v = new IgnoreRestVisitor();
	SwitchArg* ignore  = new SwitchArg(Arg::flagStartString(),
	          Arg::ignoreNameString(),
	          "Ignores the rest of the labeled arguments following this flag.",
	          false, v);
	add( ignore );
	deleteOnExit(ignore);
	deleteOnExit(v);
}